

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.h
# Opt level: O0

void __thiscall cfd::core::ExtPubkey::ExtPubkey(ExtPubkey *this,ExtPubkey *param_2)

{
  undefined8 uVar1;
  long in_RSI;
  long in_RDI;
  Pubkey *this_00;
  Pubkey *in_stack_ffffffffffffffb8;
  ByteData256 *in_stack_ffffffffffffffc0;
  
  ByteData::ByteData((ByteData *)in_stack_ffffffffffffffc0,&in_stack_ffffffffffffffb8->data_);
  uVar1 = *(undefined8 *)(in_RSI + 0x20);
  *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_RSI + 0x18);
  *(undefined8 *)(in_RDI + 0x20) = uVar1;
  ByteData256::ByteData256(in_stack_ffffffffffffffc0,(ByteData256 *)in_stack_ffffffffffffffb8);
  this_00 = (Pubkey *)(in_RDI + 0x40);
  Pubkey::Pubkey(this_00,in_stack_ffffffffffffffb8);
  ByteData256::ByteData256((ByteData256 *)this_00,(ByteData256 *)in_stack_ffffffffffffffb8);
  return;
}

Assistant:

class CFD_CORE_EXPORT ExtPubkey {
 public:
  /**
   * @brief mainnet pubkey version (BIP32_VER_MAIN_PUBLIC)
   */
  static constexpr uint32_t kVersionMainnetPubkey = 0x0488b21e;
  /**
   * @brief testnet pubkey version (BIP32_VER_TEST_PUBLIC)
   */
  static constexpr uint32_t kVersionTestnetPubkey = 0x043587cf;

  /**
   * @brief constructor.
   */
  ExtPubkey();
  /**
   * @brief constructor.
   * @param[in] serialize_data  serialize data
   */
  explicit ExtPubkey(const ByteData& serialize_data);
  /**
   * @brief constructor.
   * @param[in] serialize_data  serialize data
   * @param[in] tweak_sum       tweak sum
   */
  explicit ExtPubkey(
      const ByteData& serialize_data, const ByteData256& tweak_sum);
  /**
   * @brief constructor.
   * @param[in] base58_data  base58 data
   */
  explicit ExtPubkey(const std::string& base58_data);
  /**
   * @brief constructor.
   * @param[in] base58_data  base58 data
   * @param[in] tweak_sum    tweak sum
   */
  explicit ExtPubkey(
      const std::string& base58_data, const ByteData256& tweak_sum);
  /**
   * @brief constructor.
   * @param[in] network_type       network type
   * @param[in] parent_key         parent pubkey
   * @param[in] parent_chain_code  parent chain code
   * @param[in] parent_depth       parent depth
   * @param[in] child_num          child num
   */
  explicit ExtPubkey(
      NetType network_type, const Pubkey& parent_key,
      const ByteData256& parent_chain_code, uint8_t parent_depth,
      uint32_t child_num);
  /**
   * @brief constructor.
   * @param[in] network_type  network type
   * @param[in] parent_key    parent pubkey
   * @param[in] pubkey        pubkey
   * @param[in] chain_code    chain code
   * @param[in] depth         depth
   * @param[in] child_num     child num
   */
  explicit ExtPubkey(
      NetType network_type, const Pubkey& parent_key, const Pubkey& pubkey,
      const ByteData256& chain_code, uint8_t depth, uint32_t child_num);
  /**
   * @brief constructor.
   * @param[in] network_type        network type
   * @param[in] parent_fingerprint  parent fingerprint(4byte)
   * @param[in] pubkey              pubkey
   * @param[in] chain_code          chain code
   * @param[in] depth               depth
   * @param[in] child_num           child num
   */
  explicit ExtPubkey(
      NetType network_type, const ByteData& parent_fingerprint,
      const Pubkey& pubkey, const ByteData256& chain_code, uint8_t depth,
      uint32_t child_num);

  /**
   * @brief Get Serialize information of extended key.
   * @return serialize data
   */
  ByteData GetData() const;
  /**
   * @brief Get the Base58 string of the extended key.
   * @return base58 string
   */
  std::string ToString() const;

  /**
   * @brief Get pubkey.
   * @return Pubkey
   */
  Pubkey GetPubkey() const;
  /**
   * @brief Obtain the extended public key of the specified hierarchy.
   * @param[in] child_num         child number
   * @return extended pubkey
   * @throws CfdException If invalid seed.
   */
  ExtPubkey DerivePubkey(uint32_t child_num) const;
  /**
   * @brief Obtain the extended public key of the specified hierarchy.
   * @param[in] path              child number path
   * @return extended pubkey
   * @throws CfdException If invalid seed.
   */
  ExtPubkey DerivePubkey(const std::vector<uint32_t>& path) const;
  /**
   * @brief Obtain the extended public key of the specified hierarchy.
   * @param[in] string_path     child number string path
   * @return extended pubkey
   * @throws CfdException If invalid seed.
   */
  ExtPubkey DerivePubkey(const std::string& string_path) const;

  /**
   * @brief Derive extended pubkey.
   * @param[in] path              child number path
   * @return extended pubkey
   * @throws CfdException If invalid seed.
   */
  KeyData DerivePubkeyData(const std::vector<uint32_t>& path) const;
  /**
   * @brief Derive extended pubkey.
   * @param[in] string_path       child number string path
   * @return extended pubkey
   * @throws CfdException If invalid seed.
   */
  KeyData DerivePubkeyData(const std::string& string_path) const;

  /**
   * @brief Get the tweak value generated in the process of generating the derived Pubkey.
   * @param[in] path    child number path
   * @return tweak sum
   */
  ByteData256 DerivePubTweak(const std::vector<uint32_t>& path) const;
  /**
   * @brief Get the composite value of the tweak value generated in the process of generating the derived Pubkey.
   * @return tweak sum
   */
  ByteData256 GetPubTweakSum() const;

  /**
   * @brief Check if the data format is correct.
   * @retval true  valid
   * @retval false invalid
   */
  bool IsValid() const;

  /**
   * @brief Get depth.
   * @return depth value
   */
  uint8_t GetDepth() const;
  /**
   * @brief Get version.
   * @return version data (4byte)
   */
  uint32_t GetVersion() const;
  /**
   * @brief Get version.
   * @return version data (4byte)
   */
  ByteData GetVersionData() const;
  /**
   * @brief Get child number.
   * @return child number (4byte)
   */
  uint32_t GetChildNum() const;
  /**
   * @brief Get chain code.
   * @return chain code (32byte)
   */
  ByteData256 GetChainCode() const;
  /**
   * @brief Get fingerprint.
   * @return fingerprint data (4byte)
   */
  uint32_t GetFingerprint() const;
  /**
   * @brief Get fingerprint.
   * @return fingerprint data (4byte)
   */
  ByteData GetFingerprintData() const;
  /**
   * @brief Get network type.
   * @return network type.
   */
  NetType GetNetworkType() const;

 private:
  ByteData serialize_data_;   //!< serialize data
  uint32_t version_ = 0;      //!< version
  uint32_t fingerprint_ = 0;  //!< finger print
  uint8_t depth_ = 0;         //!< depth
  uint32_t child_num_ = 0;    //!< child number
  ByteData256 chaincode_;     //!< chain code
  Pubkey pubkey_;             //!< public key
  ByteData256 tweak_sum_;     //!< tweak sum
}